

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  LPCSTR pCVar7;
  char16_t *string1;
  char16_t *string2;
  size_t sVar8;
  JavascriptString *pJVar9;
  uint uVar10;
  charcount_t cchUseLength;
  uint in_stack_00000010;
  Var in_stack_00000020;
  char16_t local_118 [4];
  UChar match [100];
  ScopedICUObject<UEnumeration_*,_&uenum_close_70> local_40;
  ScopedUEnumeration available;
  int curLen;
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar10 = callInfo._0_4_;
  if (in_stack_00000010 != uVar10) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b64161;
    *puVar6 = 0;
  }
  if ((uVar10 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b64161;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar10 & 0xffffff) == 2) {
LAB_00b63d9f:
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if (!bVar3) goto LAB_00b63dac;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb32,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00b64161;
      *puVar6 = 0;
      if ((uVar10 & 0xffffff) == 2) goto LAB_00b63d9f;
    }
LAB_00b63dac:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb33,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b64161;
    *puVar6 = 0;
  }
  match._192_8_ = VarTo<Js::JavascriptString>(in_stack_00000020);
  available.object._4_4_ = 0;
  local_40.object =
       (UEnumeration *)
       ucal_openTimeZoneIDEnumeration_70(0,0,0,(undefined1 *)((long)&available.object + 4));
  iVar4 = uenum_count_70(local_40.object);
  if (available.object._4_4_ == 7) {
    Throw::OutOfMemory();
  }
  if (available.object._4_4_ < 1 && available.object._4_4_ != -0x7c) {
    if (0 < iVar4) goto LAB_00b63ef7;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb4b,"(availableLength > 0)","availableLength > 0");
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb4b,"(false)",pCVar7);
  }
  if (bVar3 == false) {
LAB_00b64161:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_00b63ef7:
  cchUseLength = 0;
  memset(local_118,0,200);
  if (0 < iVar4) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    sVar8 = 0;
    do {
      iVar4 = iVar4 + -1;
      available.object._0_4_ = -1;
      string1 = (char16_t *)
                uenum_unext_70(local_40.object,&available,
                               (undefined1 *)((long)&available.object + 4));
      if (available.object._4_4_ == 7) {
LAB_00b6415c:
        Throw::OutOfMemory();
      }
      if (0 < available.object._4_4_ || available.object._4_4_ == -0x7c) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xb53,"(false)",pCVar7);
        if (!bVar3) goto LAB_00b64161;
        *puVar6 = 0;
      }
      if ((int)available.object == 0) goto LAB_00b6415c;
      if ((int)available.object < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xb5c,"(curLen > 0)","curLen > 0");
        if (!bVar3) goto LAB_00b64161;
        *puVar6 = 0;
      }
      string2 = (char16_t *)(**(code **)(*(long *)match._192_8_ + 0x328))();
      iVar5 = _wcsicmp(string1,string2);
      if (iVar5 == 0) {
        ucal_getCanonicalTimeZoneID_70
                  (string1,(int)available.object,local_118,100,0,
                   (undefined1 *)((long)&available.object + 4));
        if (available.object._4_4_ == 7) goto LAB_00b6415c;
        if (0 < available.object._4_4_ || available.object._4_4_ == -0x7c) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0xb60,"(false)",pCVar7);
          if (!bVar3) goto LAB_00b64161;
          *puVar6 = 0;
        }
        sVar8 = PAL_wcslen(local_118);
        if (0x7ffffffd < sVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0xb62,"(len < MaxCharCount)",
                                      "Returned canonicalized timezone is far too long");
          if (!bVar3) goto LAB_00b64161;
          *puVar6 = 0;
        }
      }
      cchUseLength = (charcount_t)sVar8;
    } while ((iVar5 != 0) && (iVar4 != 0));
  }
  if (cchUseLength == 0) {
    pJVar9 = (JavascriptString *)
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pJVar9 = JavascriptString::NewCopyBuffer(local_118,cchUseLength,pSVar1);
  }
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            (&local_40);
  return pJVar9;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1]));

        JavascriptString *tz = VarTo<JavascriptString>(args.Values[1]);

#ifdef INTL_WINGLOB
        AutoHSTRING canonicalizedTimeZone;
        boolean isValidTimeZone = GetWindowsGlobalizationAdapter(scriptContext)->ValidateAndCanonicalizeTimeZone(scriptContext, tz->GetSz(), &canonicalizedTimeZone);
        if (isValidTimeZone)
        {
            DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
            PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*canonicalizedTimeZone, NULL);
            return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
#else
        UErrorCode status = U_ZERO_ERROR;

        // TODO(jahorto): Is this the list of timeZones that we want? How is this different from
        // the other two enum values or ucal_openTimeZones?
        ScopedUEnumeration available(ucal_openTimeZoneIDEnumeration(UCAL_ZONE_TYPE_ANY, nullptr, nullptr, &status));
        int availableLength = uenum_count(available, &status);
        ICU_ASSERT(status, availableLength > 0);

        charcount_t matchLen = 0;
        UChar match[100] = { 0 };
        for (int a = 0; a < availableLength; ++a)
        {
            int curLen = -1;
            const UChar *cur = uenum_unext(available, &curLen, &status);
            ICU_ASSERT(status, true);
            if (curLen == 0)
            {
                // OS#17175014: in rare cases, ICU will return U_ZERO_ERROR and a valid `cur` string but a length of 0
                // This only happens in an OOM during uenum_(u)next
                // Tracked by ICU: http://bugs.icu-project.org/trac/ticket/13739
                Throw::OutOfMemory();
            }

            AssertOrFailFast(curLen > 0);
            if (_wcsicmp(reinterpret_cast<const char16 *>(cur), tz->GetSz()) == 0)
            {
                ucal_getCanonicalTimeZoneID(cur, curLen, match, _countof(match), nullptr, &status);
                ICU_ASSERT(status, true);
                size_t len = wcslen(reinterpret_cast<const char16 *>(match));
                AssertMsg(len < MaxCharCount, "Returned canonicalized timezone is far too long");
                matchLen = static_cast<charcount_t>(len);
                break;
            }
        }

        if (matchLen == 0)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return JavascriptString::NewCopyBuffer(reinterpret_cast<const char16 *>(match), matchLen, scriptContext);
#endif
    }